

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTBITDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  size_t sVar1;
  size_t sVar2;
  size_t l;
  octet *v;
  
  sVar1 = derDec2(&v,&l,der,count,tag);
  sVar2 = 0xffffffffffffffff;
  if ((((sVar1 != 0xffffffffffffffff) && (l != 0)) && (*v < 8)) && (l != 1 || *v == 0)) {
    if (val != (octet *)0x0) {
      memMove(val,v + 1,l - 1);
    }
    sVar2 = sVar1;
    if (len != (size_t *)0x0) {
      *len = (l * 8 - (ulong)*v) - 8;
    }
  }
  return sVar2;
}

Assistant:

size_t derTBITDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// число битов дополнения больше 7?
	// биты дополнения в несуществующем октете?
	if (l < 1 || v[0] > 7 || v[0] != 0 && l == 1) 
		return SIZE_MAX;
	// возвратить строку
	if (val)
	{
		ASSERT(memIsValid(val, l - 1));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l - 1));
		memMove(val, v + 1, l - 1);
	}
	// возвратить битовую длину
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = (l - 1) * 8 - v[0];
	}
	return count;
}